

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

DOHcode doh_decode(uchar *doh,size_t dohlen,DNStype dnstype,dohentry *d)

{
  bool bVar1;
  DOHcode DVar2;
  ushort type;
  ushort rdlength;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint *unaff_R12;
  ushort uVar6;
  uint index;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  local_40 = 0xc;
  if (dohlen < 0xc) {
    return DOH_TOO_SMALL_BUFFER;
  }
  if (doh == (uchar *)0x0) {
    return DOH_DNS_BAD_ID;
  }
  if (*doh != '\0') {
    return DOH_DNS_BAD_ID;
  }
  if (doh[1] != '\0') {
    return DOH_DNS_BAD_ID;
  }
  if ((doh[3] & 0xf) != 0) {
    return DOH_DNS_BAD_RCODE;
  }
  uVar6 = *(ushort *)(doh + 4) << 8 | *(ushort *)(doh + 4) >> 8;
  if (uVar6 != 0) {
    unaff_R12 = &local_40;
    do {
      DVar2 = skipqname(doh,dohlen,unaff_R12);
      if (DVar2 != DOH_OK) {
        return DVar2;
      }
      local_40 = local_40 + 4;
      if (dohlen < local_40) {
        return DOH_DNS_OUT_OF_RANGE;
      }
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  uVar6 = *(ushort *)(doh + 6) << 8 | *(ushort *)(doh + 6) >> 8;
  local_3c = 0;
  do {
    if (uVar6 == 0) {
      uVar6 = *(ushort *)(doh + 8) << 8 | *(ushort *)(doh + 8) >> 8;
      if (uVar6 != 0) {
        do {
          DVar2 = skipqname(doh,dohlen,&local_40);
          if (DVar2 != DOH_OK) {
            return DVar2;
          }
          if (dohlen < local_40 + 8) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          if (dohlen < local_40 + 10) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          local_40 = local_40 +
                     (ushort)(*(ushort *)(doh + (int)(local_40 + 8)) << 8 |
                             *(ushort *)(doh + (int)(local_40 + 8)) >> 8) + 10;
          if (dohlen < local_40) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      uVar6 = *(ushort *)(doh + 10) << 8 | *(ushort *)(doh + 10) >> 8;
      if (uVar6 != 0) {
        do {
          DVar2 = skipqname(doh,dohlen,&local_40);
          if (DVar2 != DOH_OK) {
            return DVar2;
          }
          if (dohlen < local_40 + 8) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          if (dohlen < local_40 + 10) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          local_40 = local_40 +
                     (ushort)(*(ushort *)(doh + (int)(local_40 + 8)) << 8 |
                             *(ushort *)(doh + (int)(local_40 + 8)) >> 8) + 10;
          if (dohlen < local_40) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      DVar2 = DOH_DNS_MALFORMAT;
      if (local_40 == dohlen) {
        if ((((short)local_3c == 2) || (d->numcname != 0)) || (d->numaddr != 0)) {
          DVar2 = DOH_OK;
        }
        else {
          DVar2 = DOH_NO_CONTENT;
        }
      }
      return DVar2;
    }
    DVar2 = skipqname(doh,dohlen,&local_40);
    uVar4 = local_40;
    if (DVar2 == DOH_OK) {
      uVar3 = local_40 + 2;
      DVar2 = DOH_DNS_OUT_OF_RANGE;
      if (dohlen < uVar3) goto LAB_004a2bf8;
      type = *(ushort *)(doh + (int)local_40) << 8 | *(ushort *)(doh + (int)local_40) >> 8;
      local_3c = (uint)type;
      if (type != 5 && type != dnstype) {
        DVar2 = DOH_DNS_UNEXPECTED_TYPE;
        goto LAB_004a2bf8;
      }
      uVar4 = uVar3;
      if (dohlen < local_40 + 4) goto LAB_004a2bf8;
      if ((ushort)(*(ushort *)(doh + (int)uVar3) << 8 | *(ushort *)(doh + (int)uVar3) >> 8) != 1) {
        DVar2 = DOH_DNS_UNEXPECTED_CLASS;
        goto LAB_004a2bf8;
      }
      uVar4 = local_40 + 4;
      if (dohlen < local_40 + 8) goto LAB_004a2bf8;
      uVar4 = *(uint *)(doh + (int)(local_40 + 4));
      uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      if (uVar4 < d->ttl) {
        d->ttl = uVar4;
      }
      uVar4 = local_40 + 8;
      if (dohlen < local_40 + 10) goto LAB_004a2bf8;
      rdlength = *(ushort *)(doh + (int)(local_40 + 8)) << 8 |
                 *(ushort *)(doh + (int)(local_40 + 8)) >> 8;
      uVar4 = local_40 + 10;
      uVar5 = (ulong)(local_40 + rdlength + 10);
      if ((dohlen < uVar5) ||
         (local_40 = uVar4, local_38 = uVar5, DVar2 = rdata(doh,dohlen,rdlength,type,uVar4,d),
         uVar4 = local_40, DVar2 != DOH_OK)) goto LAB_004a2bf8;
      local_40 = (uint)local_38;
      uVar6 = uVar6 - 1;
      bVar1 = true;
      DVar2 = (DOHcode)unaff_R12;
    }
    else {
LAB_004a2bf8:
      local_40 = uVar4;
      bVar1 = false;
    }
    unaff_R12 = (uint *)(ulong)DVar2;
    if (!bVar1) {
      return DVar2;
    }
  } while( true );
}

Assistant:

UNITTEST DOHcode doh_decode(unsigned char *doh,
                            size_t dohlen,
                            DNStype dnstype,
                            struct dohentry *d)
{
  unsigned char rcode;
  unsigned short qdcount;
  unsigned short ancount;
  unsigned short type = 0;
  unsigned short rdlength;
  unsigned short nscount;
  unsigned short arcount;
  unsigned int index = 12;
  DOHcode rc;

  if(dohlen < 12)
    return DOH_TOO_SMALL_BUFFER; /* too small */
  if(!doh || doh[0] || doh[1])
    return DOH_DNS_BAD_ID; /* bad ID */
  rcode = doh[3] & 0x0f;
  if(rcode)
    return DOH_DNS_BAD_RCODE; /* bad rcode */

  qdcount = get16bit(doh, 4);
  while(qdcount) {
    rc = skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */
    if(dohlen < (index + 4))
      return DOH_DNS_OUT_OF_RANGE;
    index += 4; /* skip question's type and class */
    qdcount--;
  }

  ancount = get16bit(doh, 6);
  while(ancount) {
    unsigned short class;
    unsigned int ttl;

    rc = skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    type = get16bit(doh, index);
    if((type != DNS_TYPE_CNAME) && (type != dnstype))
      /* Not the same type as was asked for nor CNAME */
      return DOH_DNS_UNEXPECTED_TYPE;
    index += 2;

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;
    class = get16bit(doh, index);
    if(DNS_CLASS_IN != class)
      return DOH_DNS_UNEXPECTED_CLASS; /* unsupported */
    index += 2;

    if(dohlen < (index + 4))
      return DOH_DNS_OUT_OF_RANGE;

    ttl = get32bit(doh, index);
    if(ttl < d->ttl)
      d->ttl = ttl;
    index += 4;

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    rdlength = get16bit(doh, index);
    index += 2;
    if(dohlen < (index + rdlength))
      return DOH_DNS_OUT_OF_RANGE;

    rc = rdata(doh, dohlen, rdlength, type, index, d);
    if(rc)
      return rc; /* bad rdata */
    index += rdlength;
    ancount--;
  }

  nscount = get16bit(doh, 8);
  while(nscount) {
    rc = skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */

    if(dohlen < (index + 8))
      return DOH_DNS_OUT_OF_RANGE;

    index += 2 + 2 + 4; /* type, class and ttl */

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    rdlength = get16bit(doh, index);
    index += 2;
    if(dohlen < (index + rdlength))
      return DOH_DNS_OUT_OF_RANGE;
    index += rdlength;
    nscount--;
  }

  arcount = get16bit(doh, 10);
  while(arcount) {
    rc = skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */

    if(dohlen < (index + 8))
      return DOH_DNS_OUT_OF_RANGE;

    index += 2 + 2 + 4; /* type, class and ttl */

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    rdlength = get16bit(doh, index);
    index += 2;
    if(dohlen < (index + rdlength))
      return DOH_DNS_OUT_OF_RANGE;
    index += rdlength;
    arcount--;
  }

  if(index != dohlen)
    return DOH_DNS_MALFORMAT; /* something is wrong */

  if((type != DNS_TYPE_NS) && !d->numcname && !d->numaddr)
    /* nothing stored! */
    return DOH_NO_CONTENT;

  return DOH_OK; /* ok */
}